

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall
client_socket::set_on_read_write
          (client_socket *this,on_ready_t *on_read_ready,on_ready_t *on_write_ready)

{
  pointer piVar1;
  on_ready_t *on_write_ready_local;
  on_ready_t *on_read_ready_local;
  client_socket *this_local;
  
  piVar1 = std::unique_ptr<client_socket::impl,_std::default_delete<client_socket::impl>_>::
           operator->(&this->pimpl);
  std::function<void_()>::operator=(&piVar1->on_read_ready,on_read_ready);
  piVar1 = std::unique_ptr<client_socket::impl,_std::default_delete<client_socket::impl>_>::
           operator->(&this->pimpl);
  std::function<void_()>::operator=(&piVar1->on_write_ready,on_write_ready);
  piVar1 = std::unique_ptr<client_socket::impl,_std::default_delete<client_socket::impl>_>::
           operator->(&this->pimpl);
  impl::update_registration(piVar1);
  return;
}

Assistant:

void client_socket::set_on_read_write(on_ready_t on_read_ready,
                                      on_ready_t on_write_ready)
{
    pimpl->on_read_ready = std::move(on_read_ready);
    pimpl->on_write_ready = std::move(on_write_ready);
    pimpl->update_registration();
}